

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactNSC.h
# Opt level: O1

void __thiscall
chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>::Reset
          (ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_> *this,
          ChContactable_1vars<6> *mobjA,ChContactable_1vars<3> *mobjB,ChCollisionInfo *cinfo,
          ChMaterialCompositeNSC *mat)

{
  ChMatrix33<double> *pCVar1;
  type_constraint_tuple_a *this_00;
  type_constraint_tuple_b *this_01;
  type_constraint_tuple_a *this_02;
  type_constraint_tuple_b *this_03;
  type_constraint_tuple_a *this_04;
  type_constraint_tuple_b *this_05;
  ChContactable_1vars<6> *pCVar2;
  ChContactable_1vars<3> *pCVar3;
  float *pfVar4;
  double dVar5;
  
  ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>::Reset_cinfo
            (&this->
              super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>,
             mobjA,mobjB,cinfo);
  this_00 = &(this->Nx).
             super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
             .tuple_a;
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::SetVariables
            (this_00,&((this->
                       super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>
                       ).objA)->super_ChVariableTupleCarrier_1vars<6>);
  this_01 = &(this->Nx).
             super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
             .tuple_b;
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_>::SetVariables
            (this_01,&((this->
                       super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>
                       ).objB)->super_ChVariableTupleCarrier_1vars<3>);
  this_02 = &(this->Tu).
             super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
             .tuple_a;
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::SetVariables
            (this_02,&((this->
                       super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>
                       ).objA)->super_ChVariableTupleCarrier_1vars<6>);
  this_03 = &(this->Tu).
             super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
             .tuple_b;
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_>::SetVariables
            (this_03,&((this->
                       super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>
                       ).objB)->super_ChVariableTupleCarrier_1vars<3>);
  this_04 = &(this->Tv).
             super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
             .tuple_a;
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<6>_>::SetVariables
            (this_04,&((this->
                       super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>
                       ).objA)->super_ChVariableTupleCarrier_1vars<6>);
  this_05 = &(this->Tv).
             super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
             .tuple_b;
  ChConstraintTuple_1vars<chrono::ChVariableTupleCarrier_1vars<3>_>::SetVariables
            (this_05,&((this->
                       super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>
                       ).objB)->super_ChVariableTupleCarrier_1vars<3>);
  *(double *)
   &(this->Nx).
    super_ChConstraintTwoTuples<chrono::ChVariableTupleCarrier_1vars<6>,_chrono::ChVariableTupleCarrier_1vars<3>_>
    .field_0xf8 = (double)mat->static_friction;
  *(double *)&(this->Nx).field_0x100 = (double)mat->cohesion;
  this->restitution = (double)mat->restitution;
  this->dampingf = (double)mat->dampingf;
  this->compliance = (double)mat->compliance;
  this->complianceT = (double)mat->complianceT;
  this->reactions_cache = cinfo->reaction_cache;
  pCVar2 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>).
           objA;
  pCVar1 = &(this->
            super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>).
            contact_plane;
  (*(pCVar2->super_ChContactable)._vptr_ChContactable[0x11])
            (pCVar2,&(this->
                     super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>
                     ).p1,pCVar1,this_00,this_02,this_04,0);
  pCVar3 = (this->
           super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>).
           objB;
  (*(pCVar3->super_ChContactable)._vptr_ChContactable[0x11])
            (pCVar3,&(this->
                     super_ChContactTuple<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>
                     ).p2,pCVar1,this_01,this_03,this_05,1);
  pfVar4 = this->reactions_cache;
  if (pfVar4 == (float *)0x0) {
    if (this == (ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_> *)
                (sBulletDNAstr64 + 0x3418)) {
      return;
    }
    (this->react_force).m_data[0] = VNULL;
    (this->react_force).m_data[1] = DAT_00b90ac0;
    dVar5 = DAT_00b90ac8;
  }
  else {
    (this->react_force).m_data[0] = (double)*pfVar4;
    (this->react_force).m_data[1] = (double)pfVar4[1];
    dVar5 = (double)pfVar4[2];
  }
  (this->react_force).m_data[2] = dVar5;
  return;
}

Assistant:

virtual void Reset(Ta* mobjA,                                ///< collidable object A
                       Tb* mobjB,                                ///< collidable object B
                       const collision::ChCollisionInfo& cinfo,  ///< data for the collision pair
                       const ChMaterialCompositeNSC& mat         ///< composite material
    ) {
        // Reset geometric information
        this->Reset_cinfo(mobjA, mobjB, cinfo);

        Nx.Get_tuple_a().SetVariables(*this->objA);
        Nx.Get_tuple_b().SetVariables(*this->objB);
        Tu.Get_tuple_a().SetVariables(*this->objA);
        Tu.Get_tuple_b().SetVariables(*this->objB);
        Tv.Get_tuple_a().SetVariables(*this->objA);
        Tv.Get_tuple_b().SetVariables(*this->objB);

        // Cache composite material properties
        Nx.SetFrictionCoefficient(mat.static_friction);
        Nx.SetCohesion(mat.cohesion);

        this->restitution = mat.restitution;
        this->dampingf = mat.dampingf;
        this->compliance = mat.compliance;
        this->complianceT = mat.complianceT;

        this->reactions_cache = cinfo.reaction_cache;

        // COMPUTE JACOBIANS

        // delegate objA to compute its half of jacobian
        this->objA->ComputeJacobianForContactPart(this->p1, this->contact_plane, Nx.Get_tuple_a(), Tu.Get_tuple_a(),
                                                  Tv.Get_tuple_a(), false);

        // delegate objB to compute its half of jacobian
        this->objB->ComputeJacobianForContactPart(this->p2, this->contact_plane, Nx.Get_tuple_b(), Tu.Get_tuple_b(),
                                                  Tv.Get_tuple_b(), true);

		if (reactions_cache) {
			react_force.x() = reactions_cache[0];
			react_force.y() = reactions_cache[1];
			react_force.z() = reactions_cache[2];
			//GetLog() << "Reset Fn=" << (double)reactions_cache[0] << "  at cache address:" << (int)this->reactions_cache << "\n";
		}
		else {
			react_force = VNULL;
		}
    }